

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O3

Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_> *
parseV5EntryFormat(Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_>
                   *__return_storage_ptr__,DWARFDataExtractor *DebugLineData,uint64_t *OffsetPtr,
                  uint64_t EndPrologueOffset,ContentTypeTracker *ContentTypes)

{
  size_t MinCapacity;
  uint *puVar1;
  byte bVar2;
  unsigned_long *Vals_1;
  DWARFDataExtractor *this;
  uint uVar3;
  byte bVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  AlignedCharArrayUnion<(anonymous_namespace)::ContentDescriptor> AVar7;
  char *pcVar8;
  Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_> *extraout_RAX;
  Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_> *pEVar9;
  Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_> *extraout_RAX_00;
  Error *Err;
  void *FirstEl;
  long *plVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  error_code EC;
  error_code EC_00;
  uint64_t EndPrologueOffset_local;
  Error local_a8;
  uint64_t local_a0;
  unsigned_long *local_98;
  DWARFDataExtractor *local_90;
  char local_88 [8];
  char local_80 [8];
  char local_78 [8];
  undefined1 local_70 [8];
  ContentDescriptors Descriptors;
  
  local_70 = (undefined1  [8])
             &Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
              super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
              super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>.
              super_SmallVectorBase.Size;
  Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
  super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
  super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>.
  super_SmallVectorBase.BeginX = (void *)0x400000000;
  local_a0 = EndPrologueOffset;
  Descriptors.super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>.InlineElts[3].
  buffer = (char  [8])ContentTypes;
  bVar4 = llvm::DataExtractor::getU8(&DebugLineData->super_DataExtractor,OffsetPtr,(Error *)0x0);
  if (bVar4 != 0) {
    uVar11 = (uint)bVar4;
    local_78 = Descriptors.super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>.
               InlineElts[3].buffer + 3;
    local_88 = Descriptors.super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>.
               InlineElts[3].buffer + 2;
    local_80 = Descriptors.super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>.
               InlineElts[3].buffer + 1;
    bVar4 = 0;
    local_98 = OffsetPtr;
    local_90 = DebugLineData;
    do {
      bVar2 = bVar4;
      this = local_90;
      Vals_1 = local_98;
      if (local_a0 <= *local_98) {
        pcVar8 = (char *)std::_V2::generic_category();
        EC._M_cat = (error_category *)0x16;
        EC._0_8_ = &EndPrologueOffset_local;
        llvm::createStringError<unsigned_long,unsigned_long>
                  (EC,pcVar8,
                   (unsigned_long *)
                   "failed to parse entry content descriptions at offset 0x%8.8lx because offset extends beyond the prologue end at offset 0x%8.8lx"
                   ,Vals_1);
        Err = (Error *)&EndPrologueOffset_local;
        goto LAB_00af2b52;
      }
      uVar5 = llvm::DataExtractor::getULEB128(&local_90->super_DataExtractor,local_98,(Error *)0x0);
      uVar6 = llvm::DataExtractor::getULEB128(&this->super_DataExtractor,Vals_1,(Error *)0x0);
      iVar12 = (int)uVar5;
      if (Descriptors.super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>.
          InlineElts[3].buffer != (char  [8])0x0) {
        if (iVar12 < 5) {
          AVar7 = Descriptors.super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>
                  .InlineElts[3];
          if ((iVar12 == 3) || (AVar7.buffer = local_80, iVar12 == 4)) {
LAB_00af2a44:
            *(undefined1 *)AVar7.buffer = 1;
          }
        }
        else {
          AVar7.buffer = local_88;
          if ((iVar12 == 5) || (AVar7.buffer = local_78, iVar12 == 0x2001)) goto LAB_00af2a44;
        }
      }
      if (Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
          super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
          super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>.
          super_SmallVectorBase.BeginX._4_4_ <=
          (uint)Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
                super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
                super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>.
                super_SmallVectorBase.BeginX) {
        llvm::SmallVectorBase::grow_pod
                  ((SmallVectorBase *)local_70,
                   &Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
                    super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
                    super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>.
                    super_SmallVectorBase.Size,0,8);
      }
      *(uint64_t *)
       ((long)local_70 +
       (ulong)(uint)Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
                    super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
                    super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>.
                    super_SmallVectorBase.BeginX * 8) =
           uVar5 & 0xffffffff | (uVar6 & 0xffff) << 0x20;
      uVar3 = (uint)Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
                    super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
                    super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>.
                    super_SmallVectorBase.BeginX;
      pEVar9 = (Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_> *)
               (ulong)Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
                      super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
                      super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>
                      .super_SmallVectorBase.BeginX._4_4_;
      if (Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
          super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
          super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>.
          super_SmallVectorBase.BeginX._4_4_ <=
          (uint)Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
                super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
                super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>.
                super_SmallVectorBase.BeginX) goto LAB_00af2bdf;
      MinCapacity = ((ulong)Descriptors.
                            super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
                            super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>
                            .
                            super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>
                            .super_SmallVectorBase.BeginX & 0xffffffff) + 1;
      uVar13 = (uint)MinCapacity;
      Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
      super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
      super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>.
      super_SmallVectorBase.BeginX =
           (void *)CONCAT44(Descriptors.
                            super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
                            super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>
                            .
                            super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>
                            .super_SmallVectorBase.BeginX._4_4_,uVar13);
      uVar11 = uVar11 - 1;
      puVar1 = &Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
                super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
                super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>.
                super_SmallVectorBase.Size;
      bVar4 = bVar2 | iVar12 == 1;
    } while (uVar11 != 0);
    if ((bool)(bVar2 | iVar12 == 1)) {
      __return_storage_ptr__->field_0x30 = __return_storage_ptr__->field_0x30 & 0xfe;
      FirstEl = (void *)((long)&__return_storage_ptr__->field_0 + 0x10);
      *(void **)&__return_storage_ptr__->field_0 = FirstEl;
      *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 8) = 0x400000000;
      if ((Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_> *)local_70 ==
          __return_storage_ptr__) goto LAB_00af2b6d;
      if (local_70 == (undefined1  [8])puVar1) {
        uVar11 = uVar13;
        if (uVar3 < 4) {
LAB_00af2bba:
          memcpy(FirstEl,(void *)local_70,(ulong)uVar11 << 3);
        }
        else {
          llvm::SmallVectorBase::grow_pod
                    ((SmallVectorBase *)__return_storage_ptr__,FirstEl,MinCapacity,8);
          if ((uint)Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
                    super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
                    super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>.
                    super_SmallVectorBase.BeginX != 0) {
            FirstEl = *(void **)(__return_storage_ptr__->field_0).ErrorStorage.buffer;
            uVar11 = (uint)Descriptors.
                           super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
                           super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>
                           .
                           super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>
                           .super_SmallVectorBase.BeginX;
            goto LAB_00af2bba;
          }
        }
        if (*(uint *)((long)&__return_storage_ptr__->field_0 + 0xc) <= uVar3) {
LAB_00af2bdf:
          __assert_fail("N <= capacity()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                        ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
        }
        *(uint *)((long)&__return_storage_ptr__->field_0 + 8) = uVar13;
      }
      else {
        *(undefined1 (*) [8])&__return_storage_ptr__->field_0 = local_70;
        *(uint *)((long)&__return_storage_ptr__->field_0 + 8) = uVar13;
        *(uint *)((long)&__return_storage_ptr__->field_0 + 0xc) =
             Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
             super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
             super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>.
             super_SmallVectorBase.BeginX._4_4_;
        Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
        super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
        super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>.
        super_SmallVectorBase.BeginX = (void *)0x0;
        __return_storage_ptr__ = pEVar9;
        local_70 = (undefined1  [8])puVar1;
      }
      Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
      super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
      super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>.
      super_SmallVectorBase.BeginX =
           (void *)((ulong)Descriptors.
                           super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
                           super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>
                           .
                           super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>
                           .super_SmallVectorBase.BeginX & 0xffffffff00000000);
      pEVar9 = __return_storage_ptr__;
      goto LAB_00af2b6d;
    }
  }
  pcVar8 = (char *)std::_V2::generic_category();
  EC_00._M_cat = (error_category *)0x16;
  EC_00._0_8_ = &local_a8;
  llvm::createStringError(EC_00,pcVar8);
  Err = &local_a8;
LAB_00af2b52:
  llvm::Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_>::Expected
            (__return_storage_ptr__,Err);
  plVar10 = (long *)((ulong)Err->Payload & 0xfffffffffffffffe);
  pEVar9 = extraout_RAX;
  if (plVar10 != (long *)0x0) {
    pEVar9 = (Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_> *)
             (**(code **)(*plVar10 + 8))();
  }
LAB_00af2b6d:
  if (local_70 !=
      (undefined1  [8])
      &Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
       super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
       super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>.
       super_SmallVectorBase.Size) {
    free((void *)local_70);
    pEVar9 = extraout_RAX_00;
  }
  return pEVar9;
}

Assistant:

static llvm::Expected<ContentDescriptors>
parseV5EntryFormat(const DWARFDataExtractor &DebugLineData, uint64_t *OffsetPtr,
                   uint64_t EndPrologueOffset,
                   DWARFDebugLine::ContentTypeTracker *ContentTypes) {
  ContentDescriptors Descriptors;
  int FormatCount = DebugLineData.getU8(OffsetPtr);
  bool HasPath = false;
  for (int I = 0; I != FormatCount; ++I) {
    if (*OffsetPtr >= EndPrologueOffset)
      return createStringError(
          errc::invalid_argument,
          "failed to parse entry content descriptions at offset "
          "0x%8.8" PRIx64
          " because offset extends beyond the prologue end at offset "
          "0x%8.8" PRIx64,
          *OffsetPtr, EndPrologueOffset);
    ContentDescriptor Descriptor;
    Descriptor.Type =
      dwarf::LineNumberEntryFormat(DebugLineData.getULEB128(OffsetPtr));
    Descriptor.Form = dwarf::Form(DebugLineData.getULEB128(OffsetPtr));
    if (Descriptor.Type == dwarf::DW_LNCT_path)
      HasPath = true;
    if (ContentTypes)
      ContentTypes->trackContentType(Descriptor.Type);
    Descriptors.push_back(Descriptor);
  }

  if (!HasPath)
    return createStringError(errc::invalid_argument,
                             "failed to parse entry content descriptions"
                             " because no path was found");
  return Descriptors;
}